

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d63_q1a_hiatus.cpp
# Opt level: O1

int main(void)

{
  _Rb_tree_header *p_Var1;
  istream *piVar2;
  iterator iVar3;
  ostream *poVar4;
  bool bVar5;
  int b;
  int a;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_> d
  ;
  int local_7c;
  _Rb_tree_color local_78;
  int local_74;
  pair<int,_int> local_70;
  int local_64;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_60;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105160) = 0;
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(piVar2,&local_74);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar5 = local_64 != 0;
  local_64 = local_64 + -1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (bVar5) {
    do {
      piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_78);
      std::istream::operator>>(piVar2,&local_7c);
      local_70.second = local_7c;
      local_70.first = local_78;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)&local_60,&local_70);
      bVar5 = local_64 != 0;
      local_64 = local_64 + -1;
    } while (bVar5);
  }
  bVar5 = local_74 != 0;
  local_74 = local_74 + -1;
  if (bVar5) {
    do {
      piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_78);
      std::istream::operator>>(piVar2,&local_7c);
      local_70.second = local_7c;
      local_70.first = local_78;
      iVar3 = std::
              _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              ::find(&local_60,&local_70);
      if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
        do {
          if (((int)local_78 <
               (int)local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color) ||
             ((local_78 == local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color &&
              (local_7c <
               *(int *)&local_60._M_impl.super__Rb_tree_header._M_header._M_left[1].field_0x4)))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-1 -1 ",6);
            goto LAB_00101421;
          }
          if (local_7c < 2) {
            local_7c = 0xc;
            local_78 = local_78 - _S_black;
          }
          else {
            local_7c = local_7c + -1;
          }
          local_70.second = local_7c;
          local_70.first = local_78;
          iVar3 = std::
                  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                  ::find(&local_60,&local_70);
        } while ((_Rb_tree_header *)iVar3._M_node == p_Var1);
        poVar4 = (ostream *)
                 std::ostream::operator<<((ostream *)&std::cout,iVar3._M_node[1]._M_color);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)&iVar3._M_node[1].field_0x4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0 0 ",4);
      }
LAB_00101421:
      bVar5 = local_74 != 0;
      local_74 = local_74 + -1;
    } while (bVar5);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int n, m;
    cin >> n >> m;
    set<pair<int, int>> d;

    while (n--) {
        int a, b;
        cin >> a >> b;

        d.insert(make_pair(a, b));
    }

    while (m--) {
        int a, b;
        cin >> a >> b;

        auto it = d.find(make_pair(a, b));
        if (it != d.end()) {
            cout << "0 0 ";
            continue;
        }

        while (true) {
            auto beg = d.begin();
            if (a < beg->first || ((a == beg->first) && b < beg->second)) {
                cout << "-1 -1 ";
                break;
            }

            if (b - 1 < 1) {
                b = 12;
                --a;
            } else {
                --b;
            }

            auto it2 = d.find(make_pair(a, b));
            if (it2 != d.end()) {
                cout << it2->first << " " << it2->second << " ";
                break;
            }
        }
    }
}